

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureSpecialCases.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::PreProcessTexSpecialCases(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  undefined1 *puVar1;
  byte bVar2;
  GMM_RESOURCE_TYPE GVar3;
  GFXCORE_FAMILY GVar4;
  anon_struct_8_45_9b07292e_for_Gpu aVar5;
  GMM_TEXTURE_CALC *pGVar6;
  GMM_STATUS GVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  int iVar12;
  uint32_t uVar13;
  GMM_PLATFORM_INFO *pGVar14;
  ulong uVar15;
  anon_struct_8_44_94931171_for_Info aVar16;
  uint uVar17;
  uint uVar18;
  uint32_t uVar19;
  uint local_34;
  
  pGVar14 = GmmGetPlatformInfo(this->pGmmLibContext);
  aVar5 = (pTexInfo->Flags).Gpu;
  if (((ulong)aVar5 & 0x20018402) != 0) {
    if ((aVar5._0_4_ >> 10 & 1) == 0) {
      if (((ulong)aVar5 & 0x8002) != 0) {
        pGVar6 = this->pGmmLibContext->pTextureCalc;
        GVar7 = (*pGVar6->_vptr_GmmTextureCalc[0x1d])(pGVar6,pTexInfo);
        if (((pTexInfo->Flags).Gpu.field_0x5 & 8) != 0) {
          return GVar7;
        }
        aVar16 = (pTexInfo->Flags).Info;
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)((ulong)aVar16 & 0xffffffd3fff7ffff);
        uVar15 = 0xffffff93fff7ffff;
        if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
          uVar15 = 0xffffefd3fff7ffff;
        }
        aVar16 = (anon_struct_8_44_94931171_for_Info)(uVar15 & (ulong)aVar16);
        (pTexInfo->Flags).Info = aVar16;
        uVar15 = 0x1000000000;
        if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
          uVar15 = 0x80000000000;
        }
        (pTexInfo->Flags).Info =
             (anon_struct_8_44_94931171_for_Info)((ulong)aVar16 & 0xffffffd3dfe7ffff | uVar15);
        return GVar7;
      }
      if ((aVar5._0_4_ >> 0x1d & 1) == 0) {
        if ((~(ulong)aVar5 & 0x2000010000) == 0) {
          (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar5 | 0x80000000000);
          puVar1 = &(pTexInfo->Flags).Info.field_0x2;
          *puVar1 = *puVar1 | 8;
        }
      }
      else {
        if (pTexInfo->BaseWidth == 0) {
          return GMM_ERROR;
        }
        if (pTexInfo->BaseHeight == 0) {
          return GMM_ERROR;
        }
        if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) != 0) {
          aVar16 = (pTexInfo->Flags).Info;
          (pTexInfo->Flags).Info =
               (anon_struct_8_44_94931171_for_Info)((ulong)aVar16 & 0xffffffd3fff7ffff);
          uVar15 = 0xffffffc3fff7ffff;
          if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
            uVar15 = 0xfffff7d3fff7ffff;
          }
          aVar16 = (anon_struct_8_44_94931171_for_Info)(uVar15 & (ulong)aVar16);
          (pTexInfo->Flags).Info = aVar16;
          uVar15 = 0xffffff93fff7ffff;
          if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
            uVar15 = 0xffffefd3fff7ffff;
          }
          aVar16 = (anon_struct_8_44_94931171_for_Info)(uVar15 & (ulong)aVar16);
          (pTexInfo->Flags).Info = aVar16;
          if ((pGVar14->Platform).eRenderCoreFamily - IGFX_GEN8_CORE < 5) {
            aVar16 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar16 | 0x400000000);
          }
          else if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
            aVar16 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar16 | 0x80000000000);
          }
          else {
            aVar16 = (anon_struct_8_44_94931171_for_Info)((ulong)aVar16 | 0x1000000000);
          }
          (pTexInfo->Flags).Info = aVar16;
        }
      }
    }
    else {
      uVar15 = pTexInfo->BaseWidth;
      if (uVar15 == 0) {
        return GMM_ERROR;
      }
      if ((pGVar14->HiZ).MaxWidth < uVar15) {
        return GMM_ERROR;
      }
      uVar18 = pTexInfo->BaseHeight;
      if ((ulong)uVar18 == 0) {
        return GMM_ERROR;
      }
      if ((pGVar14->HiZ).MaxHeight < (ulong)uVar18) {
        return GMM_ERROR;
      }
      GVar3 = pTexInfo->Type;
      uVar8 = 1;
      uVar17 = uVar8;
      if (GVar3 == RESOURCE_3D) {
        uVar17 = (pGVar14->HiZ).MaxDepth;
      }
      if (uVar17 < pTexInfo->Depth) {
        return GMM_ERROR;
      }
      uVar17 = pTexInfo->ArraySize;
      if (GVar3 != RESOURCE_3D) {
        if (GVar3 == RESOURCE_CUBE) {
          uVar8 = (pGVar14->HiZ).MaxArraySize / 6;
        }
        else {
          uVar8 = (pGVar14->HiZ).MaxArraySize;
        }
      }
      if (uVar8 < uVar17) {
        return GMM_ERROR;
      }
      GVar4 = (pGVar14->Platform).eRenderCoreFamily;
      if ((0xb < (int)GVar4) && ((GVar3 | RESOURCE_2D) == RESOURCE_3D)) {
        return GMM_ERROR;
      }
      if (GVar3 - RESOURCE_1D < 2) {
        local_34 = uVar17 + (uVar17 == 0);
      }
      else {
        local_34 = pTexInfo->Depth;
        if ((GVar3 != RESOURCE_3D) && (local_34 = 0, GVar3 == RESOURCE_CUBE)) {
          local_34 = 6;
          if (1 < uVar17) {
            local_34 = uVar17 * 6;
          }
        }
      }
      if ((int)GVar4 < 0xc) {
        uVar19 = (pTexInfo->MSAA).NumSamples;
      }
      else {
        uVar19 = 1;
      }
      bVar2 = pGVar14->HiZPixelsPerByte;
      uVar9 = ExpandWidth(this,(uint32_t)uVar15,0x10,uVar19);
      pTexInfo->BaseWidth = (ulong)uVar9;
      uVar9 = ExpandHeight(this,uVar18,8,uVar19);
      uVar10 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,1);
      uVar11 = ExpandHeight(this,uVar10,8,uVar19);
      if ((int)(pGVar14->Platform).eRenderCoreFamily < 0xb) {
        if (pTexInfo->Type == RESOURCE_3D) {
          uVar17 = 0;
          for (uVar18 = 0; uVar18 <= pTexInfo->MaxLod; uVar18 = uVar18 + 1) {
            uVar9 = ExpandHeight(this,uVar10 >> ((byte)uVar18 & 0x1f),8,uVar19);
            uVar15 = 1L << ((byte)uVar18 & 0x3f);
            iVar12 = 1;
            if ((uint)uVar15 <= local_34) {
              iVar12 = (int)((ulong)local_34 / (uVar15 & 0xffffffff));
            }
            uVar17 = uVar17 + iVar12 * uVar9;
          }
          uVar19 = uVar17 >> 1;
        }
        else {
          uVar19 = ((uVar9 + 0x60 + uVar11) * local_34 >> 1) + 7 & 0xfffffff8;
        }
        pTexInfo->BaseHeight = uVar19;
        pTexInfo->ArraySize = 1;
      }
      else {
        if (pTexInfo->Type == RESOURCE_3D) {
          uVar18 = 0;
          for (uVar17 = 0; uVar17 <= pTexInfo->MaxLod; uVar17 = uVar17 + 1) {
            uVar9 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar17);
            uVar9 = ExpandHeight(this,uVar9,8,uVar19);
            uVar15 = 1L << ((byte)uVar17 & 0x3f);
            iVar12 = 1;
            if ((uint)uVar15 <= local_34) {
              iVar12 = (int)((ulong)local_34 / (uVar15 & 0xffffffff));
            }
            uVar18 = uVar18 + iVar12 * uVar9;
          }
          pTexInfo->ArraySize = 0;
          uVar18 = uVar18 >> 1;
        }
        else {
          uVar10 = 0;
          for (uVar18 = 2; uVar18 <= pTexInfo->MaxLod; uVar18 = uVar18 + 1) {
            uVar13 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar18);
            uVar13 = ExpandHeight(this,uVar13,8,uVar19);
            uVar10 = uVar10 + uVar13;
          }
          if (uVar10 < uVar11) {
            uVar10 = uVar11;
          }
          if (pTexInfo->MaxLod == 0) {
            uVar10 = 0;
          }
          uVar18 = (uVar10 + uVar9) / (uint)bVar2;
          pTexInfo->ArraySize = local_34;
        }
        pTexInfo->BaseHeight = uVar18;
        (pTexInfo->Alignment).HAlign = 0x10;
        (pTexInfo->Alignment).VAlign = (uint)(8 / bVar2);
      }
      pTexInfo->BitsPerPixel = 8;
      pTexInfo->Depth = 1;
      pTexInfo->MaxLod = 0;
      (pTexInfo->MSAA).SamplePattern = GMM_MSAA_DISABLED;
      (pTexInfo->MSAA).NumSamples = 1;
      pTexInfo->Type = RESOURCE_2D;
      pTexInfo->Format = GMM_FORMAT_GENERIC_8BIT;
      aVar16 = (pTexInfo->Flags).Info;
      (pTexInfo->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)((ulong)aVar16 & 0xffffffd3fff7ffff);
      uVar15 = 0xffffff93fff7ffff;
      if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
        uVar15 = 0xffffefd3fff7ffff;
      }
      aVar16 = (anon_struct_8_44_94931171_for_Info)(uVar15 & (ulong)aVar16);
      (pTexInfo->Flags).Info = aVar16;
      uVar15 = 0x1000000000;
      if (((uint)(this->pGmmLibContext->SkuTable).field_0 & 0x40) == 0) {
        uVar15 = 0x80000000000;
      }
      (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)(uVar15 | (ulong)aVar16);
    }
  }
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::PreProcessTexSpecialCases(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_STATUS               Status    = GMM_SUCCESS;
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(!pTexInfo->Flags.Gpu.CCS &&
       !pTexInfo->Flags.Gpu.MCS &&
       !pTexInfo->Flags.Gpu.HiZ &&
       !pTexInfo->Flags.Gpu.SeparateStencil &&
       !pTexInfo->Flags.Gpu.MMC)
    {
        // Fast-out for non-special-cases.
    }
    else if(pTexInfo->Flags.Gpu.HiZ) // ######################################
    {
        // With HiZ surface creation, clients send the size/etc. parameters of
        // the associated Depth Buffer--and here we convert to the appropriate
        // HiZ creation parameters...

        if((pTexInfo->BaseWidth > 0) &&
           (pTexInfo->BaseWidth <= pPlatform->HiZ.MaxWidth) &&
           (pTexInfo->BaseHeight > 0) &&
           (pTexInfo->BaseHeight <= pPlatform->HiZ.MaxHeight) &&
           (pTexInfo->Depth <= ((pTexInfo->Type == RESOURCE_3D) ?
                                pPlatform->HiZ.MaxDepth :
                                1)) &&
           (pTexInfo->ArraySize <= ((pTexInfo->Type == RESOURCE_3D) ?
                                    1 :
                                    (pTexInfo->Type == RESOURCE_CUBE) ?
                                    pPlatform->HiZ.MaxArraySize / 6 :
                                    pPlatform->HiZ.MaxArraySize)) &&
           // SKL+ does not support HiZ surfaces for 1D and 3D surfaces
           ((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) < IGFX_GEN9_CORE) ||
            (pTexInfo->Type != RESOURCE_1D && pTexInfo->Type != RESOURCE_3D)))
        {
            uint32_t Z_Width, Z_Height, Z_Depth;

            // Latch Z_[Width/Height/Depth]...
            Z_Width  = GFX_ULONG_CAST(pTexInfo->BaseWidth);
            Z_Height = pTexInfo->BaseHeight;
            if((pTexInfo->Type == RESOURCE_1D) ||
               (pTexInfo->Type == RESOURCE_2D))
            {
                Z_Depth = GFX_MAX(pTexInfo->ArraySize, 1);
            }
            else if(pTexInfo->Type == RESOURCE_3D)
            {
                Z_Depth = pTexInfo->Depth;
            }
            else if(pTexInfo->Type == RESOURCE_CUBE)
            {
                // HW doesn't allow HiZ cube arrays, but GMM is allowing because
                // clients will redescribe depth/HiZ cube arrays as 2D arrays.
                Z_Depth = 6 * GFX_MAX(pTexInfo->ArraySize, 1);
            }
            else
            {
                __GMM_ASSERT(0); // Illegal--Should have caught at upper IF check.
                Z_Depth = 0;
            }

            // HZ_[Width/Height/QPitch] Calculation...
            {
                uint32_t h0, h1, hL, i, NumSamples, QPitch, Z_HeightL;
                uint32_t HZ_HAlign = 16, HZ_VAlign = 8;
                uint8_t  HZ_DepthRows = pPlatform->HiZPixelsPerByte;

                // HZ operates in pixel space starting from SKL. So, it does not care
                // whether the depth buffer is in MSAA mode or not.
                NumSamples =
                (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE) ?
                1 :
                pTexInfo->MSAA.NumSamples;

                pTexInfo->BaseWidth = ExpandWidth(Z_Width, HZ_HAlign, NumSamples);

                h0 = ExpandHeight(Z_Height, HZ_VAlign, NumSamples);

                Z_Height = GmmTexGetMipHeight(pTexInfo, 1);
                h1       = ExpandHeight(Z_Height, HZ_VAlign, NumSamples);

                if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE)
                {
                    if(pTexInfo->Type == RESOURCE_3D)
                    {
                        for(i = 0, Z_HeightL = 0; i <= pTexInfo->MaxLod; i++)
                        {
                            Z_Height = GmmTexGetMipHeight(pTexInfo, i);
                            hL       = ExpandHeight(Z_Height, HZ_VAlign, NumSamples);
                            Z_HeightL += (hL * GFX_MAX(1, (Z_Depth / GFX_2_TO_POWER_OF(i))));
                        }

                        pTexInfo->ArraySize  = 0;
                        pTexInfo->BaseHeight = Z_HeightL / 2;
                    }
                    else
                    {
                        for(i = 2, Z_HeightL = 0; i <= pTexInfo->MaxLod; i++)
                        {
                            Z_Height = GmmTexGetMipHeight(pTexInfo, i);
                            Z_HeightL += ExpandHeight(Z_Height, HZ_VAlign, NumSamples);
                        }

                        QPitch =
                        (pTexInfo->MaxLod > 0) ?
                        (h0 + GFX_MAX(h1, Z_HeightL)) :
                        h0;
                        QPitch /= HZ_DepthRows;
                        pTexInfo->ArraySize  = Z_Depth;
                        pTexInfo->BaseHeight = QPitch;
                    }

                    pTexInfo->Alignment.HAlign = HZ_HAlign;
                    pTexInfo->Alignment.VAlign = HZ_VAlign / HZ_DepthRows;
                }
                else //if (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN7_CORE)
                {
                    if(pTexInfo->Type == RESOURCE_3D)
                    {
                        for(i = 0, Z_HeightL = 0; i <= pTexInfo->MaxLod; i++)
                        {
                            hL = ExpandHeight(Z_Height >> i, HZ_VAlign, NumSamples);
                            Z_HeightL += (hL * GFX_MAX(1, (Z_Depth / GFX_2_TO_POWER_OF(i))));
                        }

                        pTexInfo->BaseHeight = Z_HeightL / 2;
                    }
                    else
                    {
                        QPitch = h0 + h1 + 12 * HZ_VAlign;

                        pTexInfo->BaseHeight = GFX_CEIL_DIV((QPitch * Z_Depth / 2), 8) * 8;
                    }

                    pTexInfo->ArraySize = 1;
                }
            }

            /// Native HZ Params //////////////////////////////////////////////////
            pTexInfo->BitsPerPixel       = 8;
            pTexInfo->Depth              = 1;
            pTexInfo->Format             = GMM_FORMAT_GENERIC_8BIT;
            pTexInfo->MaxLod             = 0;
            pTexInfo->MSAA.NumSamples    = 1;
            pTexInfo->MSAA.SamplePattern = GMM_MSAA_DISABLED;
            pTexInfo->Type               = RESOURCE_2D;

            // HiZ Always Tile-Y
            pTexInfo->Flags.Info.Linear  = 0;
            pTexInfo->Flags.Info.TiledW  = 0;
            pTexInfo->Flags.Info.TiledX  = 0;
            pTexInfo->Flags.Info.TiledYf = 0;
            GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);

        }
        else
        {
            GMM_ASSERTDPF(0, "Illegal HiZ creation parameters!");
            Status = GMM_ERROR;
        }
    } // HiZ
    else if(pTexInfo->Flags.Gpu.CCS ||
            pTexInfo->Flags.Gpu.MCS) // ######################################
    {
        // With CCS surface creation, clients send height, width, depth, etc. of
        // the associated RenderTarget--and here we convert to the appropriate CCS
        // creation parameters...
        __GMM_ASSERT((!pGmmLibContext->GetSkuTable().FtrTileY ||
                      (pTexInfo->Flags.Info.Linear + pTexInfo->Flags.Info.TiledW + pTexInfo->Flags.Info.TiledX + pTexInfo->Flags.Info.TiledY)) == 1);

        __GMM_ASSERT((pGmmLibContext->GetSkuTable().FtrTileY || (pTexInfo->Flags.Info.Linear + pTexInfo->Flags.Info.Tile4 + pTexInfo->Flags.Info.Tile64)) == 1);

        __GMM_ASSERT((pTexInfo->MSAA.NumSamples == 1) || (pTexInfo->MSAA.NumSamples == 2) || (pTexInfo->MSAA.NumSamples == 4) ||
                     (pTexInfo->MSAA.NumSamples == 8) || (pTexInfo->MSAA.NumSamples == 16));

        Status = pGmmLibContext->GetTextureCalc()->MSAACCSUsage(pTexInfo);

        if(!pTexInfo->Flags.Gpu.__NonMsaaLinearCCS)
        {
            // CCS Always Tile-Y (Even for Non-MSAA FastClear.)
            pTexInfo->Flags.Info.Linear  = 0;
            pTexInfo->Flags.Info.TiledW  = 0;
            pTexInfo->Flags.Info.TiledX  = 0;
            pTexInfo->Flags.Info.TiledYf = 0;

            GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);

            //Clear compression request in CCS
            pTexInfo->Flags.Info.RenderCompressed = 0;
            pTexInfo->Flags.Info.MediaCompressed  = 0;
        }

    }                                            // CCS
    else if(pTexInfo->Flags.Gpu.SeparateStencil) // ##########################
    {
        // Seperate stencil sizing is based on the associated depth buffer
        // size, however UMD manages this sizing, and GMM will allocate any
        // arbitrarily sized stencil. Stencils do have specific tiling
        // requirements however, which is handled below.

        if((pTexInfo->BaseWidth > 0) &&
           (pTexInfo->BaseHeight > 0))
        {
            __GMM_ASSERT(pTexInfo->BitsPerPixel == 8);

            if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) < IGFX_GEN7_CORE)
            {
                GMM_ASSERTDPF((pTexInfo->MaxLod == 0), "Stencil Buffer LOD's not supported!");
            }

            if(pGmmLibContext->GetSkuTable().FtrTileY)
            {
                // Separate Stencil Tile-W Gen8-Gen11, otherwise Tile-Y
                pTexInfo->Flags.Info.Linear  = 0;
                pTexInfo->Flags.Info.TiledX  = 0;
                pTexInfo->Flags.Info.TiledYf = 0;
                pTexInfo->Flags.Info.TiledW  = 0;
                GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
                GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

                if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE &&
                   GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) <= IGFX_GEN11_CORE)
                {
                    pTexInfo->Flags.Info.TiledW = 1;
                }
                else
                {
                    GMM_SET_4KB_TILE(pTexInfo->Flags, 1, pGmmLibContext);
                }
            }
            else
            {
                __GMM_ASSERT(pTexInfo->Flags.Info.Tile4 + pTexInfo->Flags.Info.Tile64 == 1);
            }
        }
        else
        {
            GMM_ASSERTDPF(0, "Illegal Separate Stencil creation parameters!");
            Status = GMM_ERROR;
        }
    } // Separate Stencil
    else if(pTexInfo->Flags.Gpu.MMC && pTexInfo->Flags.Gpu.UnifiedAuxSurface)
    {
        pTexInfo->Flags.Gpu.__NonMsaaLinearCCS = 1;
        pTexInfo->Flags.Info.Linear            = 1;
    }

    return Status;
}